

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O1

void SendPreloadMsgs(CP_Services Svcs,Evpath_WSR_Stream WSR_Stream,TimestepList_conflict TS)

{
  _Evpath_WS_Stream *p_Var1;
  ulong uVar2;
  long lVar3;
  size_t local_58;
  size_t sStack_50;
  ulong local_48;
  undefined8 uStack_40;
  char *local_38;
  
  p_Var1 = WSR_Stream->WS_Stream;
  (*Svcs->verbose)(p_Var1->CP_Stream,4,"EVPATH Sending preload messages for timestep %ld\n",
                   TS->Timestep);
  local_58 = TS->Timestep;
  sStack_50 = (TS->Data).DataSize;
  local_38 = (TS->Data).block;
  local_48 = (ulong)(uint)p_Var1->Rank;
  if (0 < WSR_Stream->ReaderCohortSize) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      if (WSR_Stream->ReaderRequestArray[uVar2] != '\0') {
        uStack_40 = *(undefined8 *)((long)&WSR_Stream->ReaderContactInfo->RS_Stream + lVar3);
        (*Svcs->verbose)(p_Var1->CP_Stream,5,
                         "EVPATH Preload message for timestep %ld, going to rank %d\n",TS->Timestep,
                         uVar2 & 0xffffffff);
        CMwrite(*(undefined8 *)((long)&WSR_Stream->ReaderContactInfo->Conn + lVar3),
                p_Var1->PreloadFormat,&local_58);
      }
      uVar2 = uVar2 + 1;
      lVar3 = lVar3 + 0x18;
    } while ((long)uVar2 < (long)WSR_Stream->ReaderCohortSize);
  }
  return;
}

Assistant:

static void SendPreloadMsgs(CP_Services Svcs, Evpath_WSR_Stream WSR_Stream, TimestepList TS)
{
    Evpath_WS_Stream WS_Stream = WSR_Stream->WS_Stream; /* pointer to writer struct */
    struct _EvpathPreloadMsg PreloadMsg;
    Svcs->verbose(WS_Stream->CP_Stream, DPPerRankVerbose,
                  "EVPATH Sending preload messages for timestep %ld\n", TS->Timestep);
    memset(&PreloadMsg, 0, sizeof(PreloadMsg));
    PreloadMsg.Timestep = TS->Timestep;
    PreloadMsg.DataLength = TS->Data.DataSize;
    PreloadMsg.Data = TS->Data.block;
    PreloadMsg.WriterRank = WS_Stream->Rank;

    for (int i = 0; i < WSR_Stream->ReaderCohortSize; i++)
    {
        if (WSR_Stream->ReaderRequestArray[i])
        {
            PreloadMsg.RS_Stream = WSR_Stream->ReaderContactInfo[i].RS_Stream;
            Svcs->verbose(WS_Stream->CP_Stream, DPTraceVerbose,
                          "EVPATH Preload message for timestep %ld, going to rank %d\n",
                          TS->Timestep, i);
            CMwrite(WSR_Stream->ReaderContactInfo[i].Conn, WS_Stream->PreloadFormat, &PreloadMsg);
        }
    }
}